

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSimBase.c
# Opt level: O1

Vec_Wrd_t * Gia_ManSimBitPacking(Gia_Man_t *p,Vec_Int_t *vCexStore,int nCexes,int nUnDecs)

{
  uint uVar1;
  int iVar2;
  int nLits;
  int iVar3;
  Vec_Wrd_t *vSimsIn;
  word *__s;
  word wVar4;
  Vec_Wrd_t *vSimsCare;
  word *__s_00;
  Vec_Wrd_t *pVVar5;
  int nWords;
  uint iPat;
  int iVar6;
  ulong uVar7;
  long lVar8;
  uint uVar9;
  ulong uVar10;
  
  nWords = ((nCexes >> 6) + 1) - (uint)((nCexes & 0x3fU) == 0);
  uVar7 = (long)p->vCis->nSize * (long)nWords;
  vSimsIn = (Vec_Wrd_t *)malloc(0x10);
  iVar2 = (int)uVar7;
  iVar6 = 0x10;
  if (0xe < iVar2 - 1U) {
    iVar6 = iVar2;
  }
  vSimsIn->nSize = 0;
  vSimsIn->nCap = iVar6;
  if (iVar6 == 0) {
    __s = (word *)0x0;
  }
  else {
    __s = (word *)malloc((long)iVar6 << 3);
  }
  vSimsIn->pArray = __s;
  vSimsIn->nSize = iVar2;
  memset(__s,0,uVar7 * 8);
  if (0 < iVar2) {
    uVar10 = 0;
    do {
      wVar4 = Abc_RandomW(0);
      __s[uVar10] = wVar4;
      uVar10 = uVar10 + 1;
    } while ((uVar7 & 0xffffffff) != uVar10);
  }
  lVar8 = (long)p->vCis->nSize * (long)nWords;
  vSimsCare = (Vec_Wrd_t *)malloc(0x10);
  iVar2 = (int)lVar8;
  iVar6 = 0x10;
  if (0xe < iVar2 - 1U) {
    iVar6 = iVar2;
  }
  vSimsCare->nSize = 0;
  vSimsCare->nCap = iVar6;
  iPat = 0;
  if (iVar6 == 0) {
    __s_00 = (word *)0x0;
  }
  else {
    __s_00 = (word *)malloc((long)iVar6 << 3);
  }
  vSimsCare->pArray = __s_00;
  vSimsCare->nSize = iVar2;
  memset(__s_00,0,lVar8 * 8);
  uVar9 = 0;
  iVar2 = nUnDecs + nCexes;
  if (iVar2 != 0 && SCARRY4(nUnDecs,nCexes) == iVar2 < 0) {
    uVar9 = 0;
    iPat = 0;
    iVar6 = iVar2;
    do {
      if ((((int)uVar9 < 0) || (iVar3 = vCexStore->nSize, iVar3 <= (int)uVar9)) ||
         (uVar1 = uVar9 + 1, iVar3 <= (int)uVar1)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      uVar9 = uVar9 + 2;
      nLits = vCexStore->pArray[uVar1];
      if (nLits != -1) {
        if (iVar3 <= (int)uVar9) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
        }
        iVar3 = Gia_ManSimBitPackOne(nWords,vSimsIn,vSimsCare,iPat,vCexStore->pArray + uVar9,nLits);
        iPat = iVar3 + iPat;
        if (iVar2 < (int)iPat) {
          __assert_fail("iPat <= nCexes + nUnDecs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaSimBase.c"
                        ,0x143,"Vec_Wrd_t *Gia_ManSimBitPacking(Gia_Man_t *, Vec_Int_t *, int, int)"
                       );
        }
        uVar9 = nLits + uVar9;
      }
      iVar6 = iVar6 + -1;
    } while (iVar6 != 0);
  }
  if (uVar9 != vCexStore->nSize) {
    __assert_fail("iCur == Vec_IntSize(vCexStore)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaSimBase.c"
                  ,0x146,"Vec_Wrd_t *Gia_ManSimBitPacking(Gia_Man_t *, Vec_Int_t *, int, int)");
  }
  uVar9 = (((int)(iPat + 1) >> 6) + 1) - (uint)((iPat + 1 & 0x3f) == 0);
  pVVar5 = Gia_ManSimCombine(p->vCis->nSize,p->vSimsPi,vSimsIn,uVar9);
  printf("Compressed %d CEXes into %d patterns and added %d words to available %d words.\n",
         (ulong)(uint)nCexes,(ulong)iPat,(ulong)uVar9,
         (long)p->vSimsPi->nSize / (long)p->vCis->nSize & 0xffffffff);
  if (__s != (word *)0x0) {
    free(__s);
    vSimsIn->pArray = (word *)0x0;
  }
  free(vSimsIn);
  if (__s_00 != (word *)0x0) {
    free(__s_00);
    vSimsCare->pArray = (word *)0x0;
  }
  free(vSimsCare);
  return pVVar5;
}

Assistant:

Vec_Wrd_t * Gia_ManSimBitPacking( Gia_Man_t * p, Vec_Int_t * vCexStore, int nCexes, int nUnDecs )
{
    int c, iCur = 0, iPat = 0;
    int nWordsMax = Abc_Bit6WordNum( nCexes ); 
    Vec_Wrd_t * vSimsIn   = Vec_WrdStartRandom( Gia_ManCiNum(p) * nWordsMax );
    Vec_Wrd_t * vSimsCare = Vec_WrdStart( Gia_ManCiNum(p) * nWordsMax );
    Vec_Wrd_t * vSimsRes  = NULL;
    for ( c = 0; c < nCexes + nUnDecs; c++ )
    {
        int Out  = Vec_IntEntry( vCexStore, iCur++ );
        int Size = Vec_IntEntry( vCexStore, iCur++ );
        if ( Size == -1 )
            continue;
        iPat += Gia_ManSimBitPackOne( nWordsMax, vSimsIn, vSimsCare, iPat, Vec_IntEntryP(vCexStore, iCur), Size );
        iCur += Size;
        assert( iPat <= nCexes + nUnDecs );
        Out = 0;
    }
    assert( iCur == Vec_IntSize(vCexStore) );
    vSimsRes = Gia_ManSimCombine( Gia_ManCiNum(p), p->vSimsPi, vSimsIn, Abc_Bit6WordNum(iPat+1) );
    printf( "Compressed %d CEXes into %d patterns and added %d words to available %d words.\n", 
        nCexes, iPat, Abc_Bit6WordNum(iPat+1), Vec_WrdSize(p->vSimsPi) / Gia_ManCiNum(p) );
    Vec_WrdFree( vSimsIn );
    Vec_WrdFree( vSimsCare );
    return vSimsRes;
}